

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O2

int erkStep_SetOrder(ARKodeMem ark_mem,int ord)

{
  int iVar1;
  int iVar2;
  ARKodeERKStepMem step_mem;
  sunindextype Bliw;
  sunindextype Blrw;
  
  iVar1 = erkStep_AccessStepMem(ark_mem,"erkStep_SetOrder",&step_mem);
  if (iVar1 == 0) {
    iVar2 = 4;
    if (0 < ord) {
      iVar2 = ord;
    }
    step_mem->q = iVar2;
    step_mem->p = 0;
    step_mem->stages = 0;
    ARKodeButcherTable_Space(step_mem->B,&Bliw,&Blrw);
    ARKodeButcherTable_Free(step_mem->B);
    step_mem->B = (ARKodeButcherTable)0x0;
    ark_mem->liw = ark_mem->liw - Bliw;
    ark_mem->lrw = ark_mem->lrw - Blrw;
  }
  return iVar1;
}

Assistant:

int erkStep_SetOrder(ARKodeMem ark_mem, int ord)
{
  ARKodeERKStepMem step_mem;
  sunindextype Blrw, Bliw;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set user-provided value, or default, depending on argument */
  if (ord <= 0) { step_mem->q = Q_DEFAULT; }
  else { step_mem->q = ord; }

  /* clear Butcher tables, since user is requesting a change in method
     or a reset to defaults.  Tables will be set in ARKInitialSetup. */
  step_mem->stages = 0;
  step_mem->p      = 0;

  ARKodeButcherTable_Space(step_mem->B, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->B);
  step_mem->B = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  return (ARK_SUCCESS);
}